

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O1

void * index234(tree234 *t,int index)

{
  int count;
  int iVar1;
  node234_conflict *pnVar2;
  long lVar3;
  
  pnVar2 = t->root;
  iVar1 = 0;
  if (-1 < index && pnVar2 != (node234_conflict *)0x0) {
    lVar3 = 0;
    do {
      iVar1 = iVar1 + pnVar2->counts[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    lVar3 = 0;
    do {
      iVar1 = (iVar1 + 1) - (uint)(pnVar2->elems[lVar3] == (void *)0x0);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    if ((iVar1 <= index) || (pnVar2 = t->root, pnVar2 == (node234_conflict *)0x0)) {
      return (void *)0x0;
    }
    do {
      lVar3 = 8;
      if (pnVar2->counts[0] <= index) {
        index = index + ~pnVar2->counts[0];
        if (index < 0) {
          lVar3 = 0x38;
LAB_00163a07:
          return *(void **)((long)pnVar2->kids + lVar3 + -8);
        }
        lVar3 = 0x10;
        if (pnVar2->counts[1] <= index) {
          index = index + ~pnVar2->counts[1];
          if (index < 0) {
            lVar3 = 0x40;
            goto LAB_00163a07;
          }
          lVar3 = 0x18;
          if (pnVar2->counts[2] <= index) {
            index = index + ~pnVar2->counts[2];
            lVar3 = 0x20;
            if (index < 0) {
              lVar3 = 0x48;
              goto LAB_00163a07;
            }
          }
        }
      }
      pnVar2 = *(node234_conflict **)((long)pnVar2->kids + lVar3 + -8);
    } while (pnVar2 != (node234_conflict *)0x0);
  }
  return (void *)0x0;
}

Assistant:

void *index234(tree234 * t, int index)
{
    node234 *n;

    if (!t->root)
        return NULL;                   /* tree is empty */

    if (index < 0 || index >= countnode234(t->root))
        return NULL;                   /* out of range */

    n = t->root;

    while (n) {
        if (index < n->counts[0])
            n = n->kids[0];
        else if (index -= n->counts[0] + 1, index < 0)
            return n->elems[0];
        else if (index < n->counts[1])
            n = n->kids[1];
        else if (index -= n->counts[1] + 1, index < 0)
            return n->elems[1];
        else if (index < n->counts[2])
            n = n->kids[2];
        else if (index -= n->counts[2] + 1, index < 0)
            return n->elems[2];
        else
            n = n->kids[3];
    }

    /* We shouldn't ever get here. I wonder how we did. */
    return NULL;
}